

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void polyscope::view::setNavigateStyle(NavigateStyle newStyle,bool animateFlight)

{
  int iVar1;
  byte in_SIL;
  int in_EDI;
  NavigateStyle oldStyle;
  
  iVar1 = in_EDI;
  if ((in_EDI != 1) && ((in_EDI != 5 || (iVar1 = in_EDI, style != 0)))) {
    style = in_EDI;
    if ((in_SIL & 1) == 0) {
      resetCameraToHomeView();
      iVar1 = style;
    }
    else {
      flyToHomeView();
      iVar1 = style;
    }
  }
  style = iVar1;
  return;
}

Assistant:

void setNavigateStyle(NavigateStyle newStyle, bool animateFlight) {
  NavigateStyle oldStyle = style;
  style = newStyle;

  // for a few combinations of views, we can leave the camera where it is rather than resetting to the home view
  if (newStyle == NavigateStyle::Free ||
      (newStyle == NavigateStyle::FirstPerson && oldStyle == NavigateStyle::Turntable)) {
    return;
  }

  // reset to the home view
  if (animateFlight) {
    flyToHomeView();
  } else {
    resetCameraToHomeView();
  }
}